

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters
          (NetworkUpdateParameters *this,NetworkUpdateParameters *from)

{
  void *pvVar1;
  Optimizer *from_00;
  Int64Parameter *pIVar2;
  BoolParameter *from_01;
  Optimizer *this_00;
  Int64Parameter *pIVar3;
  BoolParameter *this_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NetworkUpdateParameters_003c10b8
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->losslayers_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->losslayers_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->losslayers_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->losslayers_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
            (&(this->losslayers_).super_RepeatedPtrFieldBase,
             &(from->losslayers_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->optimizer_;
  if (from_00 == (Optimizer *)0x0 ||
      from == (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    this_00 = (Optimizer *)0x0;
  }
  else {
    this_00 = (Optimizer *)operator_new(0x20);
    Optimizer::Optimizer(this_00,from_00);
  }
  this->optimizer_ = this_00;
  pIVar2 = from->epochs_;
  if (pIVar2 == (Int64Parameter *)0x0 ||
      from == (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    pIVar3 = (Int64Parameter *)0x0;
  }
  else {
    pIVar3 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(pIVar3,pIVar2);
  }
  this->epochs_ = pIVar3;
  from_01 = from->shuffle_;
  if (from_01 == (BoolParameter *)0x0 ||
      from == (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    this_01 = (BoolParameter *)0x0;
  }
  else {
    this_01 = (BoolParameter *)operator_new(0x18);
    BoolParameter::BoolParameter(this_01,from_01);
  }
  this->shuffle_ = this_01;
  pIVar2 = from->seed_;
  if (pIVar2 == (Int64Parameter *)0x0 ||
      from == (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    pIVar3 = (Int64Parameter *)0x0;
  }
  else {
    pIVar3 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(pIVar3,pIVar2);
  }
  this->seed_ = pIVar3;
  return;
}

Assistant:

NetworkUpdateParameters::NetworkUpdateParameters(const NetworkUpdateParameters& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      losslayers_(from.losslayers_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_optimizer()) {
    optimizer_ = new ::CoreML::Specification::Optimizer(*from.optimizer_);
  } else {
    optimizer_ = NULL;
  }
  if (from.has_epochs()) {
    epochs_ = new ::CoreML::Specification::Int64Parameter(*from.epochs_);
  } else {
    epochs_ = NULL;
  }
  if (from.has_shuffle()) {
    shuffle_ = new ::CoreML::Specification::BoolParameter(*from.shuffle_);
  } else {
    shuffle_ = NULL;
  }
  if (from.has_seed()) {
    seed_ = new ::CoreML::Specification::Int64Parameter(*from.seed_);
  } else {
    seed_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NetworkUpdateParameters)
}